

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O3

tuple<int,_int> __thiscall
rest_rpc::rpc_service::msgpack_codec::unpack<std::tuple<int,int>>
          (msgpack_codec *this,char *data,size_t length)

{
  size_t in_RCX;
  tuple<int,_int> *v;
  bool referenced;
  size_t local_50;
  undefined1 local_48 [24];
  size_t local_30;
  size_t local_28;
  size_t local_20;
  
  local_48._0_8_ = 0xffffffff;
  local_48._8_8_ = 0xffffffff;
  local_48._16_8_ = (object *)0xffffffff;
  local_30 = 0xffffffff;
  local_28 = 0xffffffff;
  local_20 = 0xffffffff;
  local_50 = 0;
  msgpack::v3::unpack((object_handle *)data,(char *)length,in_RCX,&local_50,&referenced,
                      (unpack_reference_func)0x0,(void *)0x0,(unpack_limit *)local_48);
  *(undefined8 *)&(this->msg_).m_obj.super_object = 0;
  local_48._16_8_ = *(undefined8 *)(data + 0x10);
  local_48._0_8_ = *(undefined8 *)data;
  local_48._8_8_ = *(undefined8 *)(data + 8);
  msgpack::v1::adaptor::convert<std::tuple<int,_int>,_void>::operator()
            ((convert<std::tuple<int,_int>,_void> *)&local_50,(object *)local_48,
             (tuple<int,_int> *)this);
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)this;
}

Assistant:

T unpack(char const *data, size_t length) {
    try {
      msgpack::unpack(msg_, data, length);
      return msg_.get().as<T>();
    } catch (...) {
      throw std::invalid_argument("unpack failed: Args not match!");
    }
  }